

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

string * testing::internal::FormatMatcherDescription
                   (string *__return_storage_ptr__,char *matcher_name,char *description,
                   Interpolations *interp,Strings *param_values)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pIVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  long lVar7;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*description == '\0') {
    ConvertIdentifierNameToWords_abi_cxx11_(&local_78,(internal *)matcher_name,description);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    paVar1 = &local_78.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((param_values->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (param_values->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      JoinAsTuple(&local_50,param_values);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x17b81f);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_78.field_2._M_allocated_capacity = *psVar5;
        local_78.field_2._8_8_ = plVar4[3];
        local_78._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar5;
        local_78._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_78._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  else {
    if ((interp->
        super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (interp->
        super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      lVar7 = 0;
      uVar6 = 0;
      do {
        std::__cxx11::string::replace
                  ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,
                   (char *)0x0,(ulong)description);
        iVar2 = *(int *)((long)&((interp->
                                 super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->param_index + lVar7);
        if ((long)iVar2 != -3) {
          if (iVar2 == -2) {
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
          }
          else if (iVar2 == -1) {
            JoinAsTuple(&local_78,param_values);
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
            }
          }
          else {
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,
                       (ulong)(param_values->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[iVar2]._M_dataplus._M_p);
          }
        }
        pIVar3 = (interp->
                 super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        description = *(char **)((long)&pIVar3->end_pos + lVar7);
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x18;
      } while (uVar6 < (ulong)(((long)(interp->
                                      super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3 >>
                               3) * -0x5555555555555555));
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string FormatMatcherDescription(
    const char* matcher_name, const char* description,
    const Interpolations& interp, const Strings& param_values) {
  string result;
  if (*description == '\0') {
    // When the user supplies an empty description, we calculate one
    // from the matcher name.
    result = ConvertIdentifierNameToWords(matcher_name);
    if (param_values.size() >= 1)
      result += " " + JoinAsTuple(param_values);
  } else {
    // The end position of the last interpolation.
    const char* last_interp_end = description;
    for (size_t i = 0; i < interp.size(); i++) {
      result.append(last_interp_end, interp[i].start_pos);
      const int param_index = interp[i].param_index;
      if (param_index == kTupleInterpolation) {
        result += JoinAsTuple(param_values);
      } else if (param_index == kPercentInterpolation) {
        result += '%';
      } else if (param_index != kInvalidInterpolation) {
        result += param_values[param_index];
      }
      last_interp_end = interp[i].end_pos;
    }
    result += last_interp_end;
  }

  return result;
}